

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O3

int open_get_incoming_locales(OPEN_HANDLE open,AMQP_VALUE *incoming_locales_value)

{
  int iVar1;
  AMQP_TYPE AVar2;
  int iVar3;
  AMQP_VALUE pAVar4;
  bool bVar5;
  uint32_t item_count;
  ietf_language_tag incoming_locales_single_value;
  uint local_3c;
  char *local_38;
  
  if (open == (OPEN_HANDLE)0x0) {
    return 0x699;
  }
  iVar1 = amqpvalue_get_composite_item_count(open->composite_value,&local_3c);
  if (iVar1 != 0) {
    return 0x6a1;
  }
  if (local_3c < 7) {
    return 0x6a7;
  }
  pAVar4 = amqpvalue_get_composite_item_in_place(open->composite_value,6);
  if (pAVar4 == (AMQP_VALUE)0x0) {
    return 0x6af;
  }
  AVar2 = amqpvalue_get_type(pAVar4);
  if (AVar2 == AMQP_TYPE_NULL) {
    return 0x6af;
  }
  AVar2 = amqpvalue_get_type(pAVar4);
  if (AVar2 == AMQP_TYPE_ARRAY) {
    local_38 = (char *)0x0;
    AVar2 = amqpvalue_get_type(pAVar4);
    bVar5 = true;
    if (AVar2 != AMQP_TYPE_ARRAY) {
      return 0x6c2;
    }
  }
  else {
    iVar1 = amqpvalue_get_symbol(pAVar4,&local_38);
    bVar5 = iVar1 != 0;
    AVar2 = amqpvalue_get_type(pAVar4);
    if (AVar2 != AMQP_TYPE_ARRAY) {
      if (iVar1 != 0) {
        return 0x6c2;
      }
      goto LAB_00119ab4;
    }
  }
  iVar1 = amqpvalue_get_array(pAVar4,incoming_locales_value);
  if ((bool)(iVar1 != 0 & bVar5)) {
    return 0x6c2;
  }
LAB_00119ab4:
  AVar2 = amqpvalue_get_type(pAVar4);
  iVar1 = 0;
  if (AVar2 != AMQP_TYPE_ARRAY) {
    pAVar4 = amqpvalue_create_array();
    *incoming_locales_value = pAVar4;
    if (pAVar4 == (AMQP_VALUE)0x0) {
      iVar1 = 0x6cb;
    }
    else {
      pAVar4 = amqpvalue_create_symbol(local_38);
      if (pAVar4 == (AMQP_VALUE)0x0) {
        iVar1 = 0x6d2;
      }
      else {
        iVar3 = amqpvalue_add_array_item(*incoming_locales_value,pAVar4);
        iVar1 = 0x6d8;
        if (iVar3 == 0) {
          iVar3 = amqpvalue_set_composite_item(open->composite_value,6,*incoming_locales_value);
          iVar1 = 0x6de;
          if (iVar3 == 0) {
            iVar1 = 0;
          }
        }
        amqpvalue_destroy(pAVar4);
      }
      amqpvalue_destroy(*incoming_locales_value);
    }
  }
  return iVar1;
}

Assistant:

int open_get_incoming_locales(OPEN_HANDLE open, AMQP_VALUE* incoming_locales_value)
{
    int result;

    if (open == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        uint32_t item_count;
        OPEN_INSTANCE* open_instance = (OPEN_INSTANCE*)open;
        if (amqpvalue_get_composite_item_count(open_instance->composite_value, &item_count) != 0)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (item_count <= 6)
            {
                result = MU_FAILURE;
            }
            else
            {
                AMQP_VALUE item_value = amqpvalue_get_composite_item_in_place(open_instance->composite_value, 6);
                if ((item_value == NULL) ||
                    (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL))
                {
                    result = MU_FAILURE;
                }
                else
                {
                    ietf_language_tag incoming_locales_single_value;
                    int get_single_value_result;
                    if (amqpvalue_get_type(item_value) != AMQP_TYPE_ARRAY)
                    {
                        get_single_value_result = amqpvalue_get_ietf_language_tag(item_value, &incoming_locales_single_value);
                    }
                    else
                    {
                        (void)memset((void*)&incoming_locales_single_value, 0, sizeof(incoming_locales_single_value));
                        get_single_value_result = 1;
                    }

                    if (((amqpvalue_get_type(item_value) != AMQP_TYPE_ARRAY) || (amqpvalue_get_array(item_value, incoming_locales_value) != 0)) &&
                        (get_single_value_result != 0))
                    {
                        result = MU_FAILURE;
                    }
                    else
                    {
                        if (amqpvalue_get_type(item_value) != AMQP_TYPE_ARRAY)
                        {
                            *incoming_locales_value = amqpvalue_create_array();
                            if (*incoming_locales_value == NULL)
                            {
                                result = MU_FAILURE;
                            }
                            else
                            {
                                AMQP_VALUE single_amqp_value = amqpvalue_create_ietf_language_tag(incoming_locales_single_value);
                                if (single_amqp_value == NULL)
                                {
                                    result = MU_FAILURE;
                                }
                                else
                                {
                                    if (amqpvalue_add_array_item(*incoming_locales_value, single_amqp_value) != 0)
                                    {
                                        result = MU_FAILURE;
                                    }
                                    else
                                    {
                                        if (amqpvalue_set_composite_item(open_instance->composite_value, 6, *incoming_locales_value) != 0)
                                        {
                                            result = MU_FAILURE;
                                        }
                                        else
                                        {
                                            result = 0;
                                        }
                                    }

                                    amqpvalue_destroy(single_amqp_value);
                                }
                                amqpvalue_destroy(*incoming_locales_value);
                            }
                        }
                        else
                        {
                            result = 0;
                        }
                    }
                }
            }
        }
    }

    return result;
}